

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddPropertyIdsForScopeSlotArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function)

{
  PropertyId value;
  uint32 uVar1;
  void *pvVar2;
  uint32 uVar3;
  uint i;
  ulong uVar4;
  
  if (function->scopeSlotArraySize == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      pvVar2 = FunctionProxy::GetAuxPtr(&function->super_FunctionProxy,PropertyIdsForScopeSlotArray)
      ;
      value = encodePossiblyBuiltInPropertyId(this,*(PropertyId *)((long)pvVar2 + uVar4 * 4));
      uVar1 = PrependInt32(this,builder,L"PropertyIdsForScopeSlots",value,(BufferBuilderInt32 **)0x0
                          );
      uVar3 = uVar3 + uVar1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < function->scopeSlotArraySize);
  }
  return uVar3;
}

Assistant:

uint32 AddPropertyIdsForScopeSlotArray(BufferBuilderList & builder, ParseableFunctionInfo* function)
    {
        if (function->scopeSlotArraySize == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start PropertyIdsForScopeSlotsArray"), magicStartOfPropertyIdsForScopeSlotArray);
#endif

        for (uint i = 0; i < function->scopeSlotArraySize; i++)
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(function->GetPropertyIdsForScopeSlotArray()[i]);
            size += PrependInt32(builder, _u("PropertyIdsForScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End PropertyIdsForScopeSlotsArray"), magicEndOfPropertyIdsForScopeSlotArray);
#endif

        return size;
    }